

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O3

void Image_Function::ExtractChannel
               (Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
               uint32_t startYOut,uint32_t width,uint32_t height,uint8_t channelId)

{
  byte bVar1;
  uchar uVar2;
  uint uVar3;
  uint uVar4;
  imageException *this;
  uchar *puVar5;
  uchar *puVar6;
  uchar *puVar7;
  ulong uVar8;
  uchar *puVar9;
  
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in,startXIn,startYIn,out,startXOut,startYOut,width,height);
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(out);
  bVar1 = in->_colorCount;
  if (channelId < bVar1) {
    uVar3 = out->_rowSize;
    if (height * uVar3 != 0) {
      uVar4 = in->_rowSize;
      puVar5 = out->_data + (ulong)startXOut + (ulong)(startYOut * uVar3);
      puVar6 = puVar5 + height * uVar3;
      puVar7 = in->_data + (ulong)channelId + (ulong)(startXIn * bVar1) + (ulong)(startYIn * uVar4);
      do {
        if (width != 0) {
          uVar8 = 0;
          puVar9 = puVar7;
          do {
            uVar2 = *puVar9;
            puVar9 = puVar9 + (uint)bVar1;
            puVar5[uVar8] = uVar2;
            uVar8 = uVar8 + 1;
          } while (width != uVar8);
        }
        puVar5 = puVar5 + uVar3;
        puVar7 = puVar7 + uVar4;
      } while (puVar5 != puVar6);
    }
    return;
  }
  this = (imageException *)__cxa_allocate_exception(0x28);
  imageException::imageException
            (this,"Channel ID for color image is greater than channel count in input image");
  __cxa_throw(this,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

void ExtractChannel( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut,
                         uint32_t startYOut, uint32_t width, uint32_t height, uint8_t channelId )
    {
        ParameterValidation( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
        VerifyGrayScaleImage( out );

        if( channelId >= in.colorCount() )
            throw imageException( "Channel ID for color image is greater than channel count in input image" );

        const uint32_t rowSizeIn  = in.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t colorCount = in.colorCount();

        const uint8_t * inY  = in.data()  + startYIn  * rowSizeIn  + startXIn * colorCount + channelId;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut;

        const uint8_t * outYEnd = outY + height * rowSizeOut;

        for( ; outY != outYEnd; outY += rowSizeOut, inY += rowSizeIn ) {
            const uint8_t * inX  = inY;
            uint8_t       * outX = outY;

            const uint8_t * outXEnd = outX + width;

            for( ; outX != outXEnd; ++outX, inX += colorCount )
                (*outX) = *(inX);
        }
    }